

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_EncodeMap
                 (upb_MtDataEncoder *e,char *ptr,upb_FieldType key_type,upb_FieldType value_type,
                 uint64_t key_mod,uint64_t value_mod)

{
  upb_MtDataEncoderInternal *puVar1;
  char *pcVar2;
  upb_MtDataEncoderInternal *in;
  uint64_t value_mod_local;
  uint64_t key_mod_local;
  upb_FieldType value_type_local;
  upb_FieldType key_type_local;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  puVar1 = upb_MtDataEncoder_GetInternal(e,ptr);
  (puVar1->state).enum_state.present_values_mask = 0;
  (puVar1->state).enum_state.last_written_value = 0;
  (puVar1->state).msg_state.oneof_state = kUpb_OneofState_NotStarted;
  pcVar2 = upb_MtDataEncoder_PutRaw(e,ptr,'%');
  if (pcVar2 == (char *)0x0) {
    e_local = (upb_MtDataEncoder *)0x0;
  }
  else {
    pcVar2 = upb_MtDataEncoder_PutField(e,pcVar2,key_type,1,key_mod);
    if (pcVar2 == (char *)0x0) {
      e_local = (upb_MtDataEncoder *)0x0;
    }
    else {
      e_local = (upb_MtDataEncoder *)upb_MtDataEncoder_PutField(e,pcVar2,value_type,2,value_mod);
    }
  }
  return (char *)e_local;
}

Assistant:

char* upb_MtDataEncoder_EncodeMap(upb_MtDataEncoder* e, char* ptr,
                                  upb_FieldType key_type,
                                  upb_FieldType value_type, uint64_t key_mod,
                                  uint64_t value_mod) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  in->state.msg_state.msg_modifiers = 0;
  in->state.msg_state.last_field_num = 0;
  in->state.msg_state.oneof_state = kUpb_OneofState_NotStarted;

  ptr = upb_MtDataEncoder_PutRaw(e, ptr, kUpb_EncodedVersion_MapV1);
  if (!ptr) return NULL;

  ptr = upb_MtDataEncoder_PutField(e, ptr, key_type, 1, key_mod);
  if (!ptr) return NULL;

  return upb_MtDataEncoder_PutField(e, ptr, value_type, 2, value_mod);
}